

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtMan.c
# Opt level: O1

void Rwt_ManStop(Rwt_Man_t *p)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *__ptr;
  Vec_Vec_t *pVVar3;
  long lVar4;
  long lVar5;
  
  if ((p->vClasses != (Vec_Vec_t *)0x0) && (0 < p->vClasses->nSize)) {
    lVar5 = 0;
    do {
      pVVar3 = p->vClasses;
      if (pVVar3->nSize <= lVar5) {
LAB_004e58f3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      lVar4 = 0;
      while (lVar4 < *(int *)((long)pVVar3->pArray[lVar5] + 4)) {
        pvVar1 = *(void **)(*(long *)(*(long *)((long)pVVar3->pArray[lVar5] + 8) + lVar4 * 8) + 0x20
                           );
        if (*(void **)((long)pvVar1 + 0x10) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 0x10));
          *(undefined8 *)((long)pvVar1 + 0x10) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        lVar4 = lVar4 + 1;
        pVVar3 = p->vClasses;
        if (pVVar3->nSize <= lVar5) goto LAB_004e58f3;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->vClasses->nSize);
  }
  pVVar3 = p->vClasses;
  if (pVVar3 != (Vec_Vec_t *)0x0) {
    if (0 < pVVar3->nSize) {
      lVar5 = 0;
      do {
        pvVar1 = pVVar3->pArray[lVar5];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
            *(undefined8 *)((long)pvVar1 + 8) = 0;
          }
          free(pvVar1);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pVVar3->nSize);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (void **)0x0;
    }
    free(pVVar3);
  }
  pVVar2 = p->vNodesTemp;
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vForest;
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    free(pVVar2);
  }
  __ptr = p->vLevNums;
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  pVVar2 = p->vFanins;
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vFaninsCur;
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    free(pVVar2);
  }
  Mem_FixedStop(p->pMmNode,0);
  if (p->pMapInv != (unsigned_short *)0x0) {
    free(p->pMapInv);
    p->pMapInv = (unsigned_short *)0x0;
  }
  if (p->pTable != (Rwt_Node_t **)0x0) {
    free(p->pTable);
    p->pTable = (Rwt_Node_t **)0x0;
  }
  if (p->pPractical != (char *)0x0) {
    free(p->pPractical);
    p->pPractical = (char *)0x0;
  }
  if (p->pPerms4 != (char **)0x0) {
    free(p->pPerms4);
    p->pPerms4 = (char **)0x0;
  }
  if (p == (Rwt_Man_t *)0x0) {
    return;
  }
  free(p);
  return;
}

Assistant:

void Rwt_ManStop( Rwt_Man_t * p )
{
    if ( p->vClasses )
    {
        Rwt_Node_t * pNode;
        int i, k;
        Vec_VecForEachEntry( Rwt_Node_t *, p->vClasses, pNode, i, k )
            Dec_GraphFree( (Dec_Graph_t *)pNode->pNext );
    }
    if ( p->vClasses )  Vec_VecFree( p->vClasses );
    Vec_PtrFree( p->vNodesTemp );
    Vec_PtrFree( p->vForest );
    Vec_IntFree( p->vLevNums );
    Vec_PtrFree( p->vFanins );
    Vec_PtrFree( p->vFaninsCur );
    Mem_FixedStop( p->pMmNode, 0 );
    ABC_FREE( p->pMapInv );
    ABC_FREE( p->pTable );
    ABC_FREE( p->pPractical );
    ABC_FREE( p->pPerms4 );
    ABC_FREE( p );
}